

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall Am_Object::~Am_Object(Am_Object *this)

{
  Am_Object_Data *pAVar1;
  uint uVar2;
  
  pAVar1 = this->data;
  if (pAVar1 != (Am_Object_Data *)0x0) {
    uVar2 = (pAVar1->super_Am_Wrapper).refs;
    if (uVar2 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"** Amulet_Error: ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"** Tried to delete object twice.",0x20);
      ::operator<<((ostream *)&std::cerr,this);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      Am_Error();
    }
    uVar2 = uVar2 - 1;
    (pAVar1->super_Am_Wrapper).refs = uVar2;
    if (uVar2 == 0) {
      (*(pAVar1->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])();
    }
  }
  this->data = (Am_Object_Data *)0x0;
  return;
}

Assistant:

Am_Object::~Am_Object()
{
  if (data) {
    if (data->Is_Zero())
      Am_ERROR("** Tried to delete object twice." << *this);
    data->Release();
  }
  data = nullptr;
}